

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

topk * calloc_or_throw<topk>(size_t nmemb)

{
  topk *ptVar1;
  vw_exception *this;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if (nmemb == 0) {
    ptVar1 = (topk *)0x0;
  }
  else {
    ptVar1 = (topk *)calloc(nmemb,0x30);
    if (ptVar1 == (topk *)0x0) {
      fputs("internal error: memory allocation failed!\n",_stderr);
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_190,"internal error: memory allocation failed!\n",0x2a);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/memory.h"
                 ,0x14,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  return ptVar1;
}

Assistant:

T* calloc_or_throw(size_t nmemb)
{
  if (nmemb == 0)
    return nullptr;

  void* data = calloc(nmemb, sizeof(T));
  if (data == nullptr)
  {
    const char* msg = "internal error: memory allocation failed!\n";
    // use low-level function since we're already out of memory.
    fputs(msg, stderr);
    THROW(msg);
  }
  return (T*)data;
}